

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::OrientationError::Encode(OrientationError *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  OrientationError *this_local;
  
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_AziErr).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_ElvErr).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_RotErr).super_DataTypeBase);
  return;
}

Assistant:

void OrientationError::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_AziErr
           << KDIS_STREAM m_ElvErr
           << KDIS_STREAM m_RotErr;
}